

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall
cfd::Psbt::CollectInputUtxo(Psbt *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  bool bVar1;
  ulong uVar2;
  undefined8 in_RSI;
  OutPoint *in_RDI;
  bool is_witness;
  UtxoData *utxo;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range1;
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  TxOut txout;
  OutPoint outpoint;
  undefined1 in_stack_0000039f;
  Script *in_stack_000003a0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_000003a8;
  TxOut *in_stack_000003b0;
  OutPoint *in_stack_000003b8;
  UtxoData *in_stack_000003c0;
  NetType *in_stack_000003d0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffffe78;
  Script *in_stack_fffffffffffffe80;
  Script *redeem_script_00;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  Psbt *in_stack_fffffffffffffea0;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_f8;
  undefined8 local_f0;
  Script local_e8;
  undefined1 local_b0 [120];
  OutPoint local_38;
  undefined8 local_10;
  
  local_10 = in_RSI;
  core::OutPoint::OutPoint(&local_38);
  core::TxOut::TxOut((TxOut *)(local_b0 + 0x28));
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_b0);
  core::Script::Script(&local_e8);
  local_f0 = local_10;
  local_f8._M_current =
       (UtxoData *)
       std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin(in_stack_fffffffffffffe78);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end(in_stack_fffffffffffffe78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)in_stack_fffffffffffffe80,
                            (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)in_stack_fffffffffffffe78), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator*(&local_f8);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      redeem_script_00 = (Script *)local_b0;
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::clear
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x51c2fc);
      in_stack_fffffffffffffe78 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
      in_stack_fffffffffffffe97 =
           ConvertFromUtxoData(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,
                               in_stack_000003a8,in_stack_000003a0,(bool)in_stack_0000039f,
                               in_stack_000003d0);
      if ((bool)in_stack_fffffffffffffe97) {
        core::TxOutReference::TxOutReference
                  ((TxOutReference *)&stack0xfffffffffffffea0,(TxOut *)(local_b0 + 0x28));
        SetTxInUtxo(in_stack_fffffffffffffea0,in_RDI,
                    (TxOutReference *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                    redeem_script_00,
                    (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                    in_stack_fffffffffffffe80);
        core::TxOutReference::~TxOutReference((TxOutReference *)0x51c394);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++(&local_f8);
  }
  core::Script::~Script(in_stack_fffffffffffffe80);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  core::TxOut::~TxOut((TxOut *)0x51c407);
  core::OutPoint::~OutPoint((OutPoint *)0x51c414);
  return;
}

Assistant:

void Psbt::CollectInputUtxo(const std::vector<UtxoData>& utxos) {
  OutPoint outpoint;
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  for (const auto& utxo : utxos) {
    if (utxo.descriptor.empty()) continue;
    key_list.clear();
    bool is_witness = ConvertFromUtxoData(
        utxo, &outpoint, &txout, &key_list, &redeem_script, true);
    if (is_witness) {
      SetTxInUtxo(outpoint, TxOutReference(txout), redeem_script, key_list);
    }
  }
}